

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio_ssl.cc
# Opt level: O3

int ssl_free(BIO *bio)

{
  SSL *s;
  
  s = (SSL *)bio->ptr;
  if (s != (SSL *)0x0) {
    SSL_shutdown(s);
    if (bio->shutdown != 0) {
      SSL_free(s);
    }
  }
  return 1;
}

Assistant:

static int ssl_free(BIO *bio) {
  SSL *ssl = get_ssl(bio);

  if (ssl == NULL) {
    return 1;
  }

  SSL_shutdown(ssl);
  if (bio->shutdown) {
    SSL_free(ssl);
  }

  return 1;
}